

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teamcity_messages.cpp
# Opt level: O0

void __thiscall
jetbrains::teamcity::TeamcityMessages::testFinished
          (TeamcityMessages *this,string *name,string *flowId)

{
  string local_78;
  string local_48;
  RaiiMessage local_28;
  RaiiMessage msg;
  string *flowId_local;
  string *name_local;
  TeamcityMessages *this_local;
  
  msg.m_out = (ostream *)flowId;
  anon_unknown_1::RaiiMessage::RaiiMessage(&local_28,"testFinished",this->m_out);
  std::__cxx11::string::string((string *)&local_48,(string *)name);
  anon_unknown_1::RaiiMessage::writeProperty(&local_28,"name",&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_78,(string *)msg.m_out);
  anon_unknown_1::RaiiMessage::writePropertyIfNonEmpty(&local_28,"flowId",&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  anon_unknown_1::RaiiMessage::~RaiiMessage(&local_28);
  return;
}

Assistant:

void TeamcityMessages::testFinished(const std::string& name, const std::string& flowId)
{
    RaiiMessage msg("testFinished", *m_out);

    msg.writeProperty("name", name);
    msg.writePropertyIfNonEmpty("flowId", flowId);
}